

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

Vec_Int_t * Gla_ManCollectPPis(Gla_Man_t *p,Vec_Int_t *vPis)

{
  int iVar1;
  Gla_Obj_t *pGVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  size_t __nmemb;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p_00->pArray = piVar4;
  pVVar7 = p->vAbs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      lVar5 = (long)pVVar7->pArray[lVar10];
      if ((lVar5 < 0) || (p->nObjs <= pVVar7->pArray[lVar10])) {
LAB_0056abd8:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      uVar3 = *(uint *)&pGVar2[lVar5].field_0x4;
      if ((uVar3 & 0xa4) == 0) {
        __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x4dc,"Vec_Int_t *Gla_ManCollectPPis(Gla_Man_t *, Vec_Int_t *)");
      }
      if (0x1ff < uVar3) {
        uVar9 = 0;
        do {
          iVar1 = pGVar2[lVar5].Fanins[uVar9];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0056abd8;
          if ((p->pObjs[iVar1].field_0x4 & 9) == 0) {
            Vec_IntPush(p_00,iVar1);
            uVar3 = *(uint *)&pGVar2[lVar5].field_0x4;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar3 >> 9);
        pVVar7 = p->vAbs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
    __nmemb = (size_t)p_00->nSize;
    if (1 < (long)__nmemb) {
      piVar4 = p_00->pArray;
      qsort(piVar4,__nmemb,4,Vec_IntSortCompare1);
      uVar3 = 1;
      sVar8 = 1;
      do {
        if (piVar4[sVar8] != piVar4[sVar8 - 1]) {
          lVar10 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          piVar4[lVar10] = piVar4[sVar8];
        }
        sVar8 = sVar8 + 1;
      } while (__nmemb != sVar8);
      p_00->nSize = uVar3;
      if (1 < (int)uVar3) {
        uVar6 = uVar3 >> 1;
        uVar9 = 0;
        do {
          uVar3 = uVar3 - 1;
          iVar1 = piVar4[uVar9];
          piVar4[uVar9] = piVar4[(int)uVar3];
          piVar4[(int)uVar3] = iVar1;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gla_ManCollectPPis( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Vec_Int_t * vPPis;
    Gla_Obj_t * pObj, * pFanin;
    int i, k;
    vPPis = Vec_IntAlloc( 1000 );
    if ( vPis )
        Vec_IntClear( vPis );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPPis, pObj->Fanins[k] );
            else if ( vPis && pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPis, pObj->Fanins[k] );
    }
    Vec_IntUniqify( vPPis );
    Vec_IntReverseOrder( vPPis );
    if ( vPis )
        Vec_IntUniqify( vPis );
    return vPPis;
}